

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_10 [2];
  int a;
  
  local_10[1] = 0;
  local_10[0] = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo1(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo2(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo3(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo4(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo5(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  foo6(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  int a = 0;
  std::cout << "main a = " << a << std::endl;

  foo1(a);
  std::cout << "main a = " << a << std::endl;

  try {
    foo2(a);
  } catch (...) {}
  std::cout << "main a = " << a << std::endl;

  foo3(a);
  std::cout << "main a = " << a << std::endl;

  foo4(a);
  std::cout << "main a = " << a << std::endl;

  foo5(a);
  std::cout << "main a = " << a << std::endl;

  foo6(a);
  std::cout << "main a = " << a << std::endl;

  return 0;
}